

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::AdvancedUsageManyCounters::Run(AdvancedUsageManyCounters *this)

{
  CallLogWrapper *this_00;
  undefined1 *buffers;
  GLuint *buffers_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GLuint GVar7;
  GLint GVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  allocator_type local_55;
  value_type_conflict4 local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&init_data,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uvec4 data1[64];\n  mediump uvec4 data2[64];\n  mediump uvec4 data3[64];\n  mediump uvec4 data4[64];\n  mediump uvec4 data5[64];\n  mediump uvec4 data6[64];\n  mediump uvec4 data7[64];\n  mediump uvec4 data8[64];\n} g_out;\nuniform mediump int u_active_counters[8];\nlayout(binding = 0) uniform atomic_uint ac_counter[8];\nvoid main() {\n  mediump uint offset = 8u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data1[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));\n  g_out.data2[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));\n  g_out.data3[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));\n  g_out.data4[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));\n  g_out.data5[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));\n  g_out.data6[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));\n  g_out.data7[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));\n  g_out.data8[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));\n}"
             ,(allocator<char> *)&local_54);
  GVar7 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,(string *)&init_data);
  this->prog_ = GVar7;
  std::__cxx11::string::~string((string *)&init_data);
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
  bVar2 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (bVar2) {
    local_54 = 1000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&init_data,0x400,&local_54,&local_55);
    buffers = &(this->super_BasicUsageCS).field_0x34;
    glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*(GLuint *)buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x92c0,0x1000,
               init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    buffers_00 = &this->m_ssbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers_00);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x2000,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[0]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,0);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[1]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,1);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[2]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,2);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[3]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,3);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[4]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,4);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[5]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,5);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[6]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,6);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[7]");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,7);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,*(GLuint *)buffers);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers_00);
    glu::CallLogWrapper::glDispatchCompute(this_00,8,8,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x3000);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x400,1);
    bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3e8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0,
                       0x428);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x400,0x400,1);
    bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3a8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar5 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,4,
                       0x3a8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x800,0x400,1);
    lVar11 = (ulong)(((bVar2 && bVar3) && bVar4) && bVar5) - 1;
    lVar1 = -1;
    for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 0x10) {
      if (*(int *)((long)pvVar9 + lVar10) != 1000) {
        lVar11 = lVar1;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,8,
                       1000);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0xc00,0x400,1);
    bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3e8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0xc,
                       0x428);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x1000,0x400,1);
    bVar5 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3a8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar6 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x10
                       ,0x3a8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x1400,0x400,1);
    if (!bVar6) {
      lVar11 = lVar1;
    }
    if (((!bVar2 || !bVar3) || !bVar4) || !bVar5) {
      lVar11 = lVar1;
    }
    for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 0x10) {
      if (*(int *)((long)pvVar9 + lVar10) != 1000) {
        lVar11 = lVar1;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x14
                       ,1000);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x1800,0x400,1);
    bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3e8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x18
                       ,0x428);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers_00);
    GVar7 = 0x400;
    pvVar9 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x1c00,0x400,1);
    bVar5 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,(GLuint)pvVar9,(UVec4 *)0x3e8,GVar7);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar6 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x1c
                       ,0x428);
    if (!bVar6) {
      lVar11 = lVar1;
    }
    if (((!bVar2 || !bVar3) || !bVar4) || !bVar5) {
      lVar11 = lVar1;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    lVar11 = -1;
  }
  return lVar11;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* glsl_cs = NL
			"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			"  mediump uvec4 data1[64];" NL "  mediump uvec4 data2[64];" NL "  mediump uvec4 data3[64];" NL
			"  mediump uvec4 data4[64];" NL "  mediump uvec4 data5[64];" NL "  mediump uvec4 data6[64];" NL
			"  mediump uvec4 data7[64];" NL "  mediump uvec4 data8[64];" NL "} g_out;" NL
			"uniform mediump int u_active_counters[8];" NL "layout(binding = 0) uniform atomic_uint ac_counter[8];" NL
			"void main() {" NL "  mediump uint offset = 8u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			"  g_out.data1[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));" NL
			"  g_out.data2[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));" NL
			"  g_out.data3[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));" NL
			"  g_out.data4[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));" NL
			"  g_out.data5[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));" NL
			"  g_out.data6[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));" NL
			"  g_out.data7[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));" NL
			"  g_out.data8[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		std::vector<GLuint> init_data(1024, 1000);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 1024 * sizeof(GLuint), &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glGenBuffers(1, &m_ssbo);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 8 * 64 * sizeof(UVec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		// set uniforms
		glUseProgram(prog_);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[0]"), 0);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[1]"), 1);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[2]"), 2);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[3]"), 3);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[4]"), 4);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[5]"), 5);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[6]"), 6);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[7]"), 7);

		// dispatch
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
		glDispatchCompute(8, 8, 1);

		// validate
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);
		UVec4* data;
		long   error = NO_ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 0, 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4), 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000 - 64))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 1 * sizeof(GLuint), 1000 - 64))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 2, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		for (int i = 0; i < 8 * 8; ++i)
			if (data[i].x() != 1000)
				error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 2 * sizeof(GLuint), 1000))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 3, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 3 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 4, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000 - 64))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 4 * sizeof(GLuint), 1000 - 64))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 5, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		for (int i = 0; i < 8 * 8; ++i)
			if (data[i].x() != 1000)
				error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 5 * sizeof(GLuint), 1000))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 6, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 6 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 7, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 7 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}